

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_outputParameterMissing_TestShell::createTest
          (TEST_MockParameterTest_outputParameterMissing_TestShell *this)

{
  Utest *this_00;
  TEST_MockParameterTest_outputParameterMissing_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x2b8);
  TEST_MockParameterTest_outputParameterMissing_Test::
  TEST_MockParameterTest_outputParameterMissing_Test
            ((TEST_MockParameterTest_outputParameterMissing_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, outputParameterMissing)
{
    MockFailureReporterInstaller failureReporterInstaller;

    int output;
    MockExpectedCallsListForTest expectations;
    mock().expectOneCall("foo").withOutputParameterReturning("output", &output, sizeof(output));
    mock().actualCall("foo");

    expectations.addFunction("foo")->withOutputParameterReturning("output", &output, sizeof(output));
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}